

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O1

mz_bool mz_zip_writer_add_from_zip_reader
                  (mz_zip_archive *pZip,mz_zip_archive *pSource_zip,mz_uint file_index)

{
  mz_zip_internal_state *pArray;
  mz_zip_internal_state *pmVar1;
  int iVar2;
  mz_bool mVar3;
  size_t sVar4;
  int *piVar5;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  mz_uint64 mVar9;
  void *pvVar10;
  size_t orig_size;
  undefined8 *puVar11;
  ulong uVar12;
  mz_uint32 local_header_u32 [8];
  mz_uint8 central_header [46];
  uint local_bc;
  int *local_b8;
  ulong local_b0;
  mz_uint64 local_a8;
  ulong local_a0;
  undefined8 *local_98;
  ulong local_90;
  int local_88;
  byte local_82;
  ushort local_6e;
  ushort local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined6 uStack_50;
  undefined2 local_4a;
  undefined6 uStack_48;
  undefined4 uStack_42;
  undefined4 uStack_3e;
  
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pArray = pZip->m_pState;
  if (pArray == (mz_zip_internal_state *)0x0) {
    return 0;
  }
  if (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) {
    return 0;
  }
  if ((((pSource_zip == (mz_zip_archive *)0x0) ||
       (pmVar1 = pSource_zip->m_pState, pmVar1 == (mz_zip_internal_state *)0x0)) ||
      (pSource_zip->m_total_files <= file_index)) ||
     (pSource_zip->m_zip_mode != MZ_ZIP_MODE_READING)) {
    puVar11 = (undefined8 *)0x0;
  }
  else {
    puVar11 = (undefined8 *)
              ((ulong)*(uint *)((long)(pmVar1->m_central_dir_offsets).m_p + (ulong)file_index * 4) +
              (long)(pmVar1->m_central_dir).m_p);
  }
  if (puVar11 == (undefined8 *)0x0) {
    return 0;
  }
  uVar7 = 0;
  if (pZip->m_file_offset_alignment != 0) {
    iVar2 = (int)pZip->m_file_offset_alignment;
    uVar7 = iVar2 - 1;
    uVar7 = iVar2 - ((uint)pZip->m_archive_size & uVar7) & uVar7;
  }
  if (pZip->m_total_files == 0xffff) {
    return 0;
  }
  local_a8 = pZip->m_archive_size;
  local_90 = (ulong)uVar7;
  local_a0 = local_a8 + local_90;
  if (local_a0 - 0xffffffb4 < 0xffffffff00000000) {
    return 0;
  }
  local_b0 = (ulong)*(uint *)((long)puVar11 + 0x2a);
  sVar4 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,local_b0,&local_88,0x1e);
  if (sVar4 != 0x1e) {
    return 0;
  }
  if (local_88 != 0x4034b50) {
    return 0;
  }
  mVar3 = mz_zip_writer_write_zeros(pZip,local_a8,uVar7);
  if (mVar3 == 0) {
    return 0;
  }
  if ((pZip->m_file_offset_alignment != 0) && ((pZip->m_file_offset_alignment - 1 & local_a0) != 0))
  {
    __assert_fail("(local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/contrib/zip/src/miniz.h"
                  ,0x198d,
                  "mz_bool mz_zip_writer_add_from_zip_reader(mz_zip_archive *, mz_zip_archive *, mz_uint)"
                 );
  }
  sVar4 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_a0,&local_88,0x1e);
  if (sVar4 != 0x1e) {
    return 0;
  }
  local_bc = (uint)local_6c + (uint)local_6e;
  uVar8 = (ulong)(local_bc + *(int *)((long)puVar11 + 0x14));
  uVar12 = 0x10000;
  if (uVar8 < 0x10000) {
    uVar12 = uVar8;
  }
  sVar4 = 0x10;
  if (0x10 < uVar12) {
    sVar4 = uVar12;
  }
  piVar5 = (int *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,sVar4);
  if (piVar5 == (int *)0x0) {
    return 0;
  }
  uVar12 = local_a8 + local_90 + 0x1e;
  mVar9 = local_b0 + 0x1e;
  local_98 = puVar11;
  if (uVar8 == 0) {
    sVar4 = (size_t)local_bc;
  }
  else {
    do {
      local_b8 = piVar5;
      sVar4 = 0x10000;
      if (uVar8 < 0x10000) {
        sVar4 = uVar8;
      }
      local_b0 = mVar9;
      local_a8 = uVar8;
      sVar6 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,mVar9,local_b8,sVar4);
      if ((sVar6 != sVar4) ||
         (sVar6 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar12,local_b8,sVar4), sVar6 != sVar4)) {
        local_bc = (uint)sVar4;
        goto LAB_003c2c1f;
      }
      mVar9 = local_b0 + sVar4;
      uVar12 = uVar12 + sVar4;
      uVar8 = local_a8 - sVar4;
      piVar5 = local_b8;
    } while (uVar8 != 0);
  }
  local_bc = (uint)sVar4;
  if ((local_82 & 8) != 0) {
    sVar4 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,mVar9,piVar5,0x10);
    if (sVar4 != 0x10) {
      pvVar10 = pZip->m_pAlloc_opaque;
LAB_003c2e1e:
      (*pZip->m_pFree)(pvVar10,piVar5);
      return 0;
    }
    local_bc = (uint)(*piVar5 == 0x8074b50) * 4 + 0xc;
    uVar8 = (ulong)local_bc;
    local_b8 = piVar5;
    sVar4 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar12,piVar5,uVar8);
    if (sVar4 != uVar8) {
LAB_003c2c1f:
      pvVar10 = pZip->m_pAlloc_opaque;
      piVar5 = local_b8;
      goto LAB_003c2e1e;
    }
    uVar12 = uVar12 + uVar8;
    piVar5 = local_b8;
  }
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar5);
  puVar11 = local_98;
  if (uVar12 >> 0x20 != 0) {
    return 0;
  }
  sVar4 = (pArray->m_central_dir).m_size;
  local_68 = *local_98;
  uStack_60 = local_98[1];
  uStack_58 = local_98[2];
  uStack_48 = (undefined6)((ulong)*(undefined8 *)((long)local_98 + 0x1e) >> 0x10);
  uStack_50 = (undefined6)local_98[3];
  local_4a = (undefined2)((ulong)local_98[3] >> 0x30);
  _uStack_42 = CONCAT44((int)local_a0,(int)*(undefined8 *)((long)local_98 + 0x26));
  uVar8 = sVar4 + 0x2e;
  local_a8 = uVar12;
  if (((pArray->m_central_dir).m_capacity < uVar8) &&
     (mVar3 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar8,1), mVar3 == 0)) {
    return 0;
  }
  (pArray->m_central_dir).m_size = uVar8;
  uVar12 = (ulong)(pArray->m_central_dir).m_element_size;
  local_b0 = sVar4;
  memcpy((void *)(sVar4 * uVar12 + (long)(pArray->m_central_dir).m_p),&local_68,uVar12 * 0x2e);
  local_bc = (uint)*(ushort *)(puVar11 + 4) +
             (uint)*(ushort *)((long)puVar11 + 0x1e) + (uint)*(ushort *)((long)puVar11 + 0x1c);
  uVar12 = (ulong)local_bc;
  if (local_bc != 0) {
    sVar4 = (pArray->m_central_dir).m_size;
    uVar8 = uVar12 + sVar4;
    if (((pArray->m_central_dir).m_capacity < uVar8) &&
       (local_a0 = uVar8, mVar3 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar8,1),
       uVar8 = local_a0, mVar3 == 0)) goto LAB_003c2e36;
    (pArray->m_central_dir).m_size = uVar8;
    uVar8 = (ulong)(pArray->m_central_dir).m_element_size;
    memcpy((void *)(sVar4 * uVar8 + (long)(pArray->m_central_dir).m_p),
           (void *)((long)puVar11 + 0x2e),uVar12 * uVar8);
  }
  if (*(int *)((long)&(pArray->m_central_dir).m_size + 4) != 0) {
    return 0;
  }
  local_bc = (uint)local_b0;
  sVar4 = (pArray->m_central_dir_offsets).m_size;
  uVar12 = sVar4 + 1;
  if ((uVar12 <= (pArray->m_central_dir_offsets).m_capacity) ||
     (mVar3 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir_offsets,uVar12,1), mVar3 != 0
     )) {
    (pArray->m_central_dir_offsets).m_size = uVar12;
    uVar12 = (ulong)(pArray->m_central_dir_offsets).m_element_size;
    memcpy((void *)(sVar4 * uVar12 + (long)(pArray->m_central_dir_offsets).m_p),&local_bc,uVar12);
    pZip->m_total_files = pZip->m_total_files + 1;
    pZip->m_archive_size = local_a8;
    return 1;
  }
LAB_003c2e36:
  uVar12 = local_b0;
  if (((pArray->m_central_dir).m_capacity < local_b0) &&
     (mVar3 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,local_b0,0), mVar3 == 0)) {
    return 0;
  }
  (pArray->m_central_dir).m_size = uVar12;
  return 0;
}

Assistant:

mz_bool mz_zip_writer_add_from_zip_reader(mz_zip_archive *pZip,
                                          mz_zip_archive *pSource_zip,
                                          mz_uint file_index) {
  mz_uint n, bit_flags, num_alignment_padding_bytes;
  mz_uint64 comp_bytes_remaining, local_dir_header_ofs;
  mz_uint64 cur_src_file_ofs, cur_dst_file_ofs;
  mz_uint32
      local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) /
                       sizeof(mz_uint32)];
  mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;
  mz_uint8 central_header[MZ_ZIP_CENTRAL_DIR_HEADER_SIZE];
  size_t orig_central_dir_size;
  mz_zip_internal_state *pState;
  void *pBuf;
  const mz_uint8 *pSrc_central_header;

  if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING))
    return MZ_FALSE;
  if (NULL ==
      (pSrc_central_header = mz_zip_reader_get_cdh(pSource_zip, file_index)))
    return MZ_FALSE;
  pState = pZip->m_pState;

  num_alignment_padding_bytes =
      mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

  // no zip64 support yet
  if ((pZip->m_total_files == 0xFFFF) ||
      ((pZip->m_archive_size + num_alignment_padding_bytes +
        MZ_ZIP_LOCAL_DIR_HEADER_SIZE + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE) >
       0xFFFFFFFF))
    return MZ_FALSE;

  cur_src_file_ofs =
      MZ_READ_LE32(pSrc_central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS);
  cur_dst_file_ofs = pZip->m_archive_size;

  if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs,
                           pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) !=
      MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
    return MZ_FALSE;
  if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
    return MZ_FALSE;
  cur_src_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

  if (!mz_zip_writer_write_zeros(pZip, cur_dst_file_ofs,
                                 num_alignment_padding_bytes))
    return MZ_FALSE;
  cur_dst_file_ofs += num_alignment_padding_bytes;
  local_dir_header_ofs = cur_dst_file_ofs;
  if (pZip->m_file_offset_alignment) {
    MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) ==
              0);
  }

  if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pLocal_header,
                     MZ_ZIP_LOCAL_DIR_HEADER_SIZE) !=
      MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
    return MZ_FALSE;
  cur_dst_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

  n = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS) +
      MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
  comp_bytes_remaining =
      n + MZ_READ_LE32(pSrc_central_header + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);

  if (NULL ==
      (pBuf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1,
                             (size_t)MZ_MAX(sizeof(mz_uint32) * 4,
                                            MZ_MIN(MZ_ZIP_MAX_IO_BUF_SIZE,
                                                   comp_bytes_remaining)))))
    return MZ_FALSE;

  while (comp_bytes_remaining) {
    n = (mz_uint)MZ_MIN(MZ_ZIP_MAX_IO_BUF_SIZE, comp_bytes_remaining);
    if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf,
                             n) != n) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
      return MZ_FALSE;
    }
    cur_src_file_ofs += n;

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
      return MZ_FALSE;
    }
    cur_dst_file_ofs += n;

    comp_bytes_remaining -= n;
  }

  bit_flags = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_BIT_FLAG_OFS);
  if (bit_flags & 8) {
    // Copy data descriptor
    if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf,
                             sizeof(mz_uint32) * 4) != sizeof(mz_uint32) * 4) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
      return MZ_FALSE;
    }

    n = sizeof(mz_uint32) * ((MZ_READ_LE32(pBuf) == 0x08074b50) ? 4 : 3);
    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
      return MZ_FALSE;
    }

    // cur_src_file_ofs += n;
    cur_dst_file_ofs += n;
  }
  pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);

  // no zip64 support yet
  if (cur_dst_file_ofs > 0xFFFFFFFF)
    return MZ_FALSE;

  orig_central_dir_size = pState->m_central_dir.m_size;

  memcpy(central_header, pSrc_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE);
  MZ_WRITE_LE32(central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS,
                local_dir_header_ofs);
  if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, central_header,
                              MZ_ZIP_CENTRAL_DIR_HEADER_SIZE))
    return MZ_FALSE;

  n = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_FILENAME_LEN_OFS) +
      MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_EXTRA_LEN_OFS) +
      MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_COMMENT_LEN_OFS);
  if (!mz_zip_array_push_back(
          pZip, &pState->m_central_dir,
          pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, n)) {
    mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size,
                        MZ_FALSE);
    return MZ_FALSE;
  }

  if (pState->m_central_dir.m_size > 0xFFFFFFFF)
    return MZ_FALSE;
  n = (mz_uint32)orig_central_dir_size;
  if (!mz_zip_array_push_back(pZip, &pState->m_central_dir_offsets, &n, 1)) {
    mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size,
                        MZ_FALSE);
    return MZ_FALSE;
  }

  pZip->m_total_files++;
  pZip->m_archive_size = cur_dst_file_ofs;

  return MZ_TRUE;
}